

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1eec638::VectorVarTest_DISABLED_Speed_Test::TestBody
          (VectorVarTest_DISABLED_Speed_Test *this)

{
  undefined8 *puVar1;
  long lVar2;
  pointer *__ptr;
  SEARCH_METHODS *pSVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  aom_usec_timer c_timer_;
  aom_usec_timer simd_timer_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  AssertHelper local_80;
  internal local_78 [8];
  undefined8 *local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  timeval local_58;
  timeval local_48;
  timeval local_38;
  timeval local_28;
  
  VectorVarTestBase::FillRandom((VectorVarTestBase *)this);
  iVar4 = 0;
  printf("Width = %d number of iteration is %d \n",
         (ulong)(uint)(this->super_VectorVarTest).super_VectorVarTestBase.width,5000000);
  gettimeofday(&local_58,(__timezone_ptr_t)0x0);
  lVar6 = 5000000;
  do {
    local_60 = (*(this->super_VectorVarTest).c_func)
                         ((this->super_VectorVarTest).super_VectorVarTestBase.ref_vector,
                          (this->super_VectorVarTest).super_VectorVarTestBase.src_vector,
                          (this->super_VectorVarTest).super_VectorVarTestBase.m_bwl);
    iVar4 = iVar4 + local_60;
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  iVar5 = 0;
  local_5c = iVar4;
  gettimeofday(&local_48,(__timezone_ptr_t)0x0);
  local_64 = 0;
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  lVar6 = 5000000;
  do {
    iVar4 = (*(this->super_VectorVarTest).simd_func)
                      ((this->super_VectorVarTest).super_VectorVarTestBase.ref_vector,
                       (this->super_VectorVarTest).super_VectorVarTestBase.src_vector,
                       (this->super_VectorVarTest).super_VectorVarTestBase.m_bwl);
    iVar5 = iVar5 + iVar4;
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  local_68 = iVar5;
  local_64 = iVar4;
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  lVar6 = local_48.tv_usec - local_58.tv_usec;
  iVar4 = (int)lVar6 + 1000000;
  if (-1 < lVar6) {
    iVar4 = (int)lVar6;
  }
  lVar2 = local_28.tv_usec - local_38.tv_usec;
  iVar5 = (int)lVar2 + 1000000;
  if (-1 < lVar2) {
    iVar5 = (int)lVar2;
  }
  printf("c_time = %d \t simd_time = %d \t Gain = %4.2f \n",
         (double)((float)(iVar4 + ((int)(lVar6 >> 0x3f) +
                                  ((int)local_48.tv_sec - (int)local_58.tv_sec)) * 1000000) /
                 (float)(iVar5 + ((int)(lVar2 >> 0x3f) +
                                 ((int)local_28.tv_sec - (int)local_38.tv_sec)) * 1000000)));
  testing::internal::CmpHelperEQ<int,int>(local_78,"c_var","simd_var",&local_60,&local_64);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_88._M_head_impl + 0x10),"Output mismatch \n",0x11);
    if (local_70 == (undefined8 *)0x0) {
      pSVar3 = "";
    }
    else {
      pSVar3 = (SEARCH_METHODS *)*local_70;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/avg_test.cc"
               ,0x2d9,(char *)pSVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  puVar1 = local_70;
  if (local_70 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_70 != local_70 + 2) {
      operator_delete((undefined8 *)*local_70);
    }
    operator_delete(puVar1);
  }
  testing::internal::CmpHelperEQ<int,int>(local_78,"sum_c_var","sum_simd_var",&local_5c,&local_68);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_88._M_head_impl + 0x10),"Output mismatch \n",0x11);
    if (local_70 == (undefined8 *)0x0) {
      pSVar3 = "";
    }
    else {
      pSVar3 = (SEARCH_METHODS *)*local_70;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/avg_test.cc"
               ,0x2da,(char *)pSVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_70 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_70 != local_70 + 2) {
      operator_delete((undefined8 *)*local_70);
    }
    operator_delete(local_70);
  }
  return;
}

Assistant:

TEST_P(VectorVarTest, DISABLED_Speed) {
  FillRandom();
  const int numIter = 5000000;
  printf("Width = %d number of iteration is %d \n", width, numIter);

  int sum_c_var = 0;
  int c_var = 0;

  aom_usec_timer c_timer_;
  aom_usec_timer_start(&c_timer_);
  for (size_t i = 0; i < numIter; i++) {
    c_var = calcVarC();
    sum_c_var += c_var;
  }
  aom_usec_timer_mark(&c_timer_);

  int simd_var = 0;
  int sum_simd_var = 0;
  aom_usec_timer simd_timer_;
  aom_usec_timer_start(&simd_timer_);
  for (size_t i = 0; i < numIter; i++) {
    simd_var = calcVarSIMD();
    sum_simd_var += simd_var;
  }
  aom_usec_timer_mark(&simd_timer_);

  const int c_sum_time = static_cast<int>(aom_usec_timer_elapsed(&c_timer_));
  const int simd_sum_time =
      static_cast<int>(aom_usec_timer_elapsed(&simd_timer_));

  printf("c_time = %d \t simd_time = %d \t Gain = %4.2f \n", c_sum_time,
         simd_sum_time,
         (static_cast<float>(c_sum_time) / static_cast<float>(simd_sum_time)));

  EXPECT_EQ(c_var, simd_var) << "Output mismatch \n";
  EXPECT_EQ(sum_c_var, sum_simd_var) << "Output mismatch \n";
}